

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES>
           *this,TestShaderType tested_shader_type)

{
  int iVar1;
  TestShaderType TVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  long lVar10;
  string shader_source;
  string base_variable_string;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  TestShaderType local_e4;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES> *local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar9 = 0;
  local_e4 = tested_shader_type;
  local_60 = this;
  while (supported_variable_types_map._16_8_ != 0) {
    iVar1 = (&opaque_var_types)[lVar9];
    lVar10 = 0x21f1cb8;
    lVar6 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar6 + 0x20)) {
        lVar10 = lVar6;
      }
      lVar6 = *(long *)(lVar6 + 0x10 + (ulong)(*(int *)(lVar6 + 0x20) < iVar1) * 8);
    } while (lVar6 != 0);
    if ((lVar10 == 0x21f1cb8) || (iVar1 < *(int *)(lVar10 + 0x20))) break;
    local_58 = lVar9;
    std::operator+(&local_50,"uniform ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar10 + 0x48));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_e0 = &local_d0;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_d0 = *plVar7;
      lStack_c8 = plVar3[3];
    }
    else {
      local_d0 = *plVar7;
      local_e0 = (long *)*plVar3;
    }
    local_d8 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,*(ulong *)(lVar10 + 0x28));
    local_208 = &local_1f8;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_1f8 = *plVar7;
      lStack_1f0 = plVar3[3];
    }
    else {
      local_1f8 = *plVar7;
      local_208 = (long *)*plVar3;
    }
    local_200 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_1e8 = &local_1d8;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_1d8 = *plVar7;
      lStack_1d0 = plVar3[3];
    }
    else {
      local_1d8 = *plVar7;
      local_1e8 = (long *)*plVar3;
    }
    local_1e0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_168 = &local_158;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_158 = *plVar7;
      lStack_150 = plVar3[3];
    }
    else {
      local_158 = *plVar7;
      local_168 = (long *)*plVar3;
    }
    local_160 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_168,*(ulong *)(lVar10 + 0x48));
    local_108 = &local_f8;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_f8 = *plVar7;
      lStack_f0 = plVar3[3];
    }
    else {
      local_f8 = *plVar7;
      local_108 = (long *)*plVar3;
    }
    local_100 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_c0 = &local_b0;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_b0 = *plVar7;
      lStack_a8 = plVar3[3];
    }
    else {
      local_b0 = *plVar7;
      local_c0 = (long *)*plVar3;
    }
    local_b8 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,*(ulong *)(lVar10 + 0x28));
    local_a0 = &local_90;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_90 = *plVar7;
      lStack_88 = plVar3[3];
    }
    else {
      local_90 = *plVar7;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_80 = &local_70;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_70 = *plVar7;
      lStack_68 = plVar3[3];
    }
    else {
      local_70 = *plVar7;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_288.field_2._M_allocated_capacity = *psVar8;
      local_288.field_2._8_8_ = plVar3[3];
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar8;
      local_288._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_288._M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_288,*(ulong *)(lVar10 + 0x48));
    local_2a8 = &local_298;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_298 = *plVar7;
      lStack_290 = plVar3[3];
    }
    else {
      local_298 = *plVar7;
      local_2a8 = (long *)*plVar3;
    }
    local_2a0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_248 = &local_238;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_238 = *plVar7;
      lStack_230 = plVar3[3];
    }
    else {
      local_238 = *plVar7;
      local_248 = (long *)*plVar3;
    }
    local_240 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_248,*(ulong *)(lVar10 + 0x28));
    local_228 = &local_218;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_218 = *plVar7;
      lStack_210 = plVar3[3];
    }
    else {
      local_218 = *plVar7;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_1c8 = &local_1b8;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_1b8 = *plVar7;
      lStack_1b0 = plVar3[3];
    }
    else {
      local_1b8 = *plVar7;
      local_1c8 = (long *)*plVar3;
    }
    local_1c0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = &local_198;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_198 = *plVar7;
      lStack_190 = plVar3[3];
    }
    else {
      local_198 = *plVar7;
      local_1a8 = (long *)*plVar3;
    }
    local_1a0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,*(ulong *)(lVar10 + 0x48));
    local_188 = &local_178;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_178 = *plVar7;
      lStack_170 = plVar3[3];
    }
    else {
      local_178 = *plVar7;
      local_188 = (long *)*plVar3;
    }
    local_180 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_188);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_118 = *plVar7;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar7;
      local_128 = (long *)*plVar3;
    }
    local_120 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_128,*(ulong *)(lVar10 + 0x28));
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_268.field_2._M_allocated_capacity = *psVar8;
      local_268.field_2._8_8_ = plVar3[3];
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar8;
      local_268._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_268._M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar3[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_148._M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,local_158 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_268,&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader_start_abi_cxx11_);
    std::operator+(&local_288,"    const ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar10 + 0x28));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2a8 = &local_298;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_298 = *plVar7;
      lStack_290 = plVar3[3];
    }
    else {
      local_298 = *plVar7;
      local_2a8 = (long *)*plVar3;
    }
    local_2a0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_2a8,*(ulong *)(lVar10 + 0x28));
    local_248 = &local_238;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_238 = *plVar7;
      lStack_230 = plVar3[3];
    }
    else {
      local_238 = *plVar7;
      local_248 = (long *)*plVar3;
    }
    local_240 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_228 = &local_218;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_218 = *plVar7;
      lStack_210 = plVar3[3];
    }
    else {
      local_218 = *plVar7;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_228,*(ulong *)(lVar10 + 0x28));
    local_1c8 = &local_1b8;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_1b8 = *plVar7;
      lStack_1b0 = plVar3[3];
    }
    else {
      local_1b8 = *plVar7;
      local_1c8 = (long *)*plVar3;
    }
    local_1c0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = &local_198;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_198 = *plVar7;
      lStack_190 = plVar3[3];
    }
    else {
      local_198 = *plVar7;
      local_1a8 = (long *)*plVar3;
    }
    local_1a0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,*(ulong *)(lVar10 + 0x28));
    local_188 = &local_178;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_178 = *plVar7;
      lStack_170 = plVar3[3];
    }
    else {
      local_178 = *plVar7;
      local_188 = (long *)*plVar3;
    }
    local_180 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_188);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_118 = *plVar7;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar7;
      local_128 = (long *)*plVar3;
    }
    local_120 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    TVar2 = local_e4;
    puVar4 = &set_tesseation_abi_cxx11_;
    switch(local_e4) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_268);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar4 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_268,*puVar4);
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x887);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_268,shader_end_abi_cxx11_);
    (*(local_60->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[8])(local_60,(ulong)TVar2,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    lVar9 = local_58 + 1;
    if (lVar9 == 0xf) {
      return;
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x88e);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConstructorsAndUnsizedDeclInvalidConstructors1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string =
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler1;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler2;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler3;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler4;\n\n";

			std::string shader_source = base_variable_string + shader_start;
			shader_source += "    const " + var_iterator->second.type + "[2][2] x = " + var_iterator->second.type +
							 "[2][2](" + var_iterator->second.type + "[2](my_sampler1, my_sampler2), " +
							 var_iterator->second.type + "[2](my_sampler3, my_sampler4));\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}